

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_limit_percent.cpp
# Opt level: O2

void __thiscall
duckdb::LimitPercentOperatorState::~LimitPercentOperatorState(LimitPercentOperatorState *this)

{
  ~LimitPercentOperatorState(this);
  operator_delete(this);
  return;
}

Assistant:

explicit LimitPercentOperatorState(const PhysicalLimitPercent &op) : current_offset(0) {
		D_ASSERT(op.sink_state);
		auto &gstate = op.sink_state->Cast<LimitPercentGlobalState>();
		gstate.data.InitializeScan(scan_state);
	}